

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeView::verticalOffset(QTreeView *this)

{
  int iVar1;
  QTreeViewPrivate *this_00;
  Promoted<long_long,_int> PVar2;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  int cnt;
  int offset;
  QTreeViewPrivate *d;
  int local_34;
  int local_18;
  int local_14;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTreeView *)0x8fb39a);
  if ((this_00->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerItem) {
    if ((this_00->uniformRowHeights & 1U) == 0) {
      QAbstractItemViewPrivate::executePostedLayout(in_RDI);
      local_18 = 0;
      local_10 = QList<QTreeViewItem>::size(&this_00->viewItems);
      QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_RDI);
      local_14 = QAbstractSlider::value((QAbstractSlider *)in_RDI);
      PVar2 = qMin<long_long,int>(&local_10,&local_14);
      for (local_34 = 0; local_34 < (int)PVar2; local_34 = local_34 + 1) {
        iVar1 = QTreeViewPrivate::itemHeight(this_00,local_18);
        local_18 = iVar1 + local_18;
      }
    }
    else {
      QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_RDI);
      local_18 = QAbstractSlider::value((QAbstractSlider *)in_RDI);
      local_18 = local_18 * this_00->defaultItemHeight;
    }
  }
  else {
    QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_RDI);
    local_18 = QAbstractSlider::value((QAbstractSlider *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

int QTreeView::verticalOffset() const
{
    Q_D(const QTreeView);
    if (d->verticalScrollMode == QAbstractItemView::ScrollPerItem) {
        if (d->uniformRowHeights)
            return verticalScrollBar()->value() * d->defaultItemHeight;
        // If we are scrolling per item and have non-uniform row heights,
        // finding the vertical offset in pixels is going to be relatively slow.
        // ### find a faster way to do this
        d->executePostedLayout();
        int offset = 0;
        const int cnt = qMin(d->viewItems.size(), verticalScrollBar()->value());
        for (int i = 0; i < cnt; ++i)
            offset += d->itemHeight(i);
        return offset;
    }
    // scroll per pixel
    return verticalScrollBar()->value();
}